

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_readDTableX2_wksp
                 (HUF_DTable *DTable,void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  undefined8 *puVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  U32 UVar15;
  uint uVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  U32 curr_1;
  int iVar31;
  uint *puVar32;
  size_t sVar33;
  uint uVar34;
  uint uVar35;
  int iVar36;
  U32 *rankVal0;
  U32 nbSymbols;
  U32 tableLog;
  U32 *rankVal;
  
  sVar33 = 0xffffffffffffffff;
  if (0x943 < wkspSize) {
    uVar7 = *DTable;
    uVar21 = uVar7 & 0xff;
    *(undefined8 *)((long)workSpace + 0x2cc) = 0;
    *(undefined8 *)((long)workSpace + 0x2d4) = 0;
    *(undefined8 *)((long)workSpace + 0x2c0) = 0;
    *(undefined8 *)((long)workSpace + 0x2c8) = 0;
    *(undefined8 *)((long)workSpace + 0x2b0) = 0;
    *(undefined8 *)((long)workSpace + 0x2b8) = 0;
    *(undefined8 *)((long)workSpace + 0x2a0) = 0;
    *(undefined8 *)((long)workSpace + 0x2a8) = 0;
    *(undefined8 *)((long)workSpace + 0x290) = 0;
    *(undefined8 *)((long)workSpace + 0x298) = 0;
    *(undefined8 *)((long)workSpace + 0x280) = 0;
    *(undefined8 *)((long)workSpace + 0x288) = 0;
    *(undefined8 *)((long)workSpace + 0x270) = 0;
    *(undefined8 *)((long)workSpace + 0x278) = 0;
    sVar33 = 0xffffffffffffffd4;
    if (uVar21 < 0xd) {
      rankVal = (U32 *)((long)workSpace + 0x5dc);
      sVar18 = HUF_readStats_wksp((BYTE *)((long)workSpace + 0x4dc),0x100,
                                  (U32 *)((long)workSpace + 0x270),&nbSymbols,&tableLog,src,srcSize,
                                  rankVal,0x368,0);
      sVar33 = sVar18;
      if (sVar18 < 0xffffffffffffff89) {
        cVar9 = (char)uVar7;
        sVar33 = 0xffffffffffffffd4;
        if (tableLog <= uVar21) {
          uVar34 = 0;
          UVar15 = tableLog;
          do {
            uVar26 = (ulong)UVar15;
            UVar15 = UVar15 - 1;
            uVar34 = uVar34 + 1;
          } while (((U32 *)((long)workSpace + 0x270))[uVar26] == 0);
          uVar16 = (tableLog - uVar34) + 2;
          uVar29 = 0;
          if (1 < uVar16) {
            lVar25 = 0;
            uVar28 = 0;
            do {
              uVar29 = *(int *)((long)workSpace + lVar25 * 4 + 0x274) + uVar28;
              *(uint *)((long)workSpace + lVar25 * 4 + 0x2ac) = uVar28;
              lVar25 = lVar25 + 1;
              uVar28 = uVar29;
            } while ((ulong)uVar16 - 1 != lVar25);
          }
          *(uint *)((long)workSpace + 0x2a8) = uVar29;
          if ((ulong)nbSymbols != 0) {
            uVar26 = 0;
            do {
              bVar4 = *(byte *)((long)workSpace + uVar26 + 0x4dc);
              uVar28 = *(uint *)((long)workSpace + (ulong)bVar4 * 4 + 0x2a8);
              *(uint *)((long)workSpace + (ulong)bVar4 * 4 + 0x2a8) = uVar28 + 1;
              *(char *)((long)workSpace + (ulong)uVar28 * 2 + 0x2dc) = (char)uVar26;
              *(byte *)((long)workSpace + (ulong)uVar28 * 2 + 0x2dd) = bVar4;
              uVar26 = uVar26 + 1;
            } while (nbSymbols != uVar26);
          }
          uVar28 = (uVar21 - uVar34) + 1;
          *(undefined4 *)((long)workSpace + 0x2a8) = 0;
          if (1 < uVar16) {
            lVar25 = 0;
            iVar36 = 0;
            do {
              lVar27 = lVar25 * 4;
              cVar8 = (char)lVar25;
              *(int *)((long)workSpace + lVar25 * 4 + 4) = iVar36;
              lVar25 = lVar25 + 1;
              iVar36 = (*(int *)((long)workSpace + lVar27 + 0x274) <<
                       ((cVar9 - (char)tableLog) + cVar8 & 0x1fU)) + iVar36;
            } while ((ulong)uVar16 - 1 != lVar25);
          }
          if (uVar34 < uVar28) {
            uVar26 = (ulong)uVar34;
            lVar25 = uVar26 * 0x34;
            do {
              lVar27 = (ulong)uVar16 - 1;
              puVar32 = (uint *)((long)workSpace + 4);
              if (1 < uVar16) {
                do {
                  *(uint *)((long)puVar32 + lVar25) = *puVar32 >> ((byte)uVar26 & 0x1f);
                  lVar27 = lVar27 + -1;
                  puVar32 = puVar32 + 1;
                } while (lVar27 != 0);
              }
              uVar26 = uVar26 + 1;
              lVar25 = lVar25 + 0x34;
            } while (uVar28 != (uint)uVar26);
          }
          rankVal[0xc] = *(U32 *)((long)workSpace + 0x30);
          uVar10 = *workSpace;
          uVar11 = *(undefined8 *)((long)workSpace + 8);
          uVar12 = *(undefined8 *)((long)workSpace + 0x10);
          uVar13 = *(undefined8 *)((long)workSpace + 0x18);
          uVar14 = *(undefined8 *)((long)workSpace + 0x28);
          *(undefined8 *)(rankVal + 8) = *(undefined8 *)((long)workSpace + 0x20);
          *(undefined8 *)(rankVal + 10) = uVar14;
          *(undefined8 *)(rankVal + 4) = uVar12;
          *(undefined8 *)(rankVal + 6) = uVar13;
          *(undefined8 *)rankVal = uVar10;
          *(undefined8 *)(rankVal + 2) = uVar11;
          if (uVar29 != 0) {
            iVar36 = tableLog + 1;
            puVar1 = (undefined8 *)((long)workSpace + 0x610);
            uVar26 = 0;
            do {
              uVar35 = (uint)*(byte *)((long)workSpace + uVar26 * 2 + 0x2dc);
              bVar4 = *(byte *)((long)workSpace + uVar26 * 2 + 0x2dd);
              uVar28 = iVar36 - (uint)bVar4;
              uVar16 = rankVal[bVar4];
              uVar24 = (ulong)uVar16;
              bVar20 = (byte)(uVar21 - uVar28);
              iVar17 = 1 << (bVar20 & 0x1f);
              if (uVar21 - uVar28 < uVar34) {
                uVar22 = iVar17 + uVar16;
                if (uVar16 < uVar22) {
                  do {
                    DTable[uVar24 + 1] = (uVar28 & 0xff) * 0x10000 + uVar35 + 0x1000000;
                    uVar24 = uVar24 + 1;
                  } while (uVar22 != uVar24);
                }
              }
              else {
                uVar16 = uVar28 + (iVar36 - uVar21);
                uVar19 = 1;
                if (1 < (int)uVar16) {
                  uVar19 = (ulong)uVar16;
                }
                uVar22 = *(uint *)((long)workSpace + uVar19 * 4 + 0x2a4);
                lVar25 = (ulong)uVar28 * 0x34;
                *(undefined4 *)((long)workSpace + 0x640) =
                     *(undefined4 *)((long)workSpace + lVar25 + 0x30);
                uVar10 = *(undefined8 *)((long)workSpace + lVar25);
                uVar11 = ((undefined8 *)((long)workSpace + lVar25))[1];
                puVar3 = (undefined8 *)((long)workSpace + lVar25 + 0x10);
                uVar12 = *puVar3;
                uVar13 = puVar3[1];
                puVar3 = (undefined8 *)((long)workSpace + lVar25 + 0x20);
                uVar14 = puVar3[1];
                *(undefined8 *)((long)workSpace + 0x630) = *puVar3;
                *(undefined8 *)((long)workSpace + 0x638) = uVar14;
                *(undefined8 *)((long)workSpace + 0x620) = uVar12;
                *(undefined8 *)((long)workSpace + 0x628) = uVar13;
                *puVar1 = uVar10;
                *(undefined8 *)((long)workSpace + 0x618) = uVar11;
                if ((1 < (int)uVar16) &&
                   (uVar19 = (ulong)*(uint *)((long)puVar1 + uVar19 * 4), uVar19 != 0)) {
                  uVar30 = 0;
                  do {
                    DTable[uVar24 + uVar30 + 1] = (uVar28 & 0xff) * 0x10000 + uVar35 + 0x1000000;
                    uVar30 = uVar30 + 1;
                  } while (uVar19 != uVar30);
                }
                if (uVar29 != uVar22) {
                  uVar19 = 0;
                  do {
                    bVar5 = *(byte *)((long)workSpace + uVar19 * 2 + (ulong)uVar22 * 2 + 0x2dc);
                    bVar6 = *(byte *)((long)workSpace + uVar19 * 2 + (ulong)uVar22 * 2 + 0x2dd);
                    iVar31 = 1 << (bVar20 - (char)(iVar36 - (uint)bVar6) & 0x1f);
                    uVar23 = *(uint *)((long)puVar1 + (ulong)bVar6 * 4);
                    uVar16 = iVar31 + uVar23;
                    do {
                      uVar30 = (ulong)uVar23;
                      uVar23 = uVar23 + 1;
                      DTable[uVar24 + uVar30 + 1] =
                           (((iVar36 - (uint)bVar6) + uVar28 & 0xff) << 0x10 | (uint)bVar5 << 8) +
                           uVar35 + 0x2000000;
                    } while (uVar23 < uVar16);
                    piVar2 = (int *)((long)puVar1 + (ulong)bVar6 * 4);
                    *piVar2 = *piVar2 + iVar31;
                    uVar19 = uVar19 + 1;
                  } while (uVar19 != uVar29 - uVar22);
                }
              }
              rankVal[bVar4] = rankVal[bVar4] + iVar17;
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar29);
          }
          *(char *)DTable = cVar9;
          *(undefined1 *)((long)DTable + 1) = 1;
          *(char *)((long)DTable + 2) = cVar9;
          *(char *)((long)DTable + 3) = (char)(uVar7 >> 0x18);
          sVar33 = sVar18;
        }
      }
    }
  }
  return sVar33;
}

Assistant:

size_t HUF_readDTableX2_wksp(HUF_DTable* DTable,
                       const void* src, size_t srcSize,
                             void* workSpace, size_t wkspSize)
{
    U32 tableLog, maxW, sizeOfSort, nbSymbols;
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    U32 const maxTableLog = dtd.maxTableLog;
    size_t iSize;
    void* dtPtr = DTable+1;   /* force compiler to avoid strict-aliasing */
    HUF_DEltX2* const dt = (HUF_DEltX2*)dtPtr;
    U32 *rankStart;

    HUF_ReadDTableX2_Workspace* const wksp = (HUF_ReadDTableX2_Workspace*)workSpace;

    if (sizeof(*wksp) > wkspSize) return ERROR(GENERIC);

    rankStart = wksp->rankStart0 + 1;
    ZSTD_memset(wksp->rankStats, 0, sizeof(wksp->rankStats));
    ZSTD_memset(wksp->rankStart0, 0, sizeof(wksp->rankStart0));

    DEBUG_STATIC_ASSERT(sizeof(HUF_DEltX2) == sizeof(HUF_DTable));   /* if compiler fails here, assertion is wrong */
    if (maxTableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    /* ZSTD_memset(weightList, 0, sizeof(weightList)); */  /* is not necessary, even though some analyzer complain ... */

    iSize = HUF_readStats_wksp(wksp->weightList, HUF_SYMBOLVALUE_MAX + 1, wksp->rankStats, &nbSymbols, &tableLog, src, srcSize, wksp->calleeWksp, sizeof(wksp->calleeWksp), /* bmi2 */ 0);
    if (HUF_isError(iSize)) return iSize;

    /* check result */
    if (tableLog > maxTableLog) return ERROR(tableLog_tooLarge);   /* DTable can't fit code depth */

    /* find maxWeight */
    for (maxW = tableLog; wksp->rankStats[maxW]==0; maxW--) {}  /* necessarily finds a solution before 0 */

    /* Get start index of each weight */
    {   U32 w, nextRankStart = 0;
        for (w=1; w<maxW+1; w++) {
            U32 curr = nextRankStart;
            nextRankStart += wksp->rankStats[w];
            rankStart[w] = curr;
        }
        rankStart[0] = nextRankStart;   /* put all 0w symbols at the end of sorted list*/
        sizeOfSort = nextRankStart;
    }

    /* sort symbols by weight */
    {   U32 s;
        for (s=0; s<nbSymbols; s++) {
            U32 const w = wksp->weightList[s];
            U32 const r = rankStart[w]++;
            wksp->sortedSymbol[r].symbol = (BYTE)s;
            wksp->sortedSymbol[r].weight = (BYTE)w;
        }
        rankStart[0] = 0;   /* forget 0w symbols; this is beginning of weight(1) */
    }

    /* Build rankVal */
    {   U32* const rankVal0 = wksp->rankVal[0];
        {   int const rescale = (maxTableLog-tableLog) - 1;   /* tableLog <= maxTableLog */
            U32 nextRankVal = 0;
            U32 w;
            for (w=1; w<maxW+1; w++) {
                U32 curr = nextRankVal;
                nextRankVal += wksp->rankStats[w] << (w+rescale);
                rankVal0[w] = curr;
        }   }
        {   U32 const minBits = tableLog+1 - maxW;
            U32 consumed;
            for (consumed = minBits; consumed < maxTableLog - minBits + 1; consumed++) {
                U32* const rankValPtr = wksp->rankVal[consumed];
                U32 w;
                for (w = 1; w < maxW+1; w++) {
                    rankValPtr[w] = rankVal0[w] >> consumed;
    }   }   }   }

    HUF_fillDTableX2(dt, maxTableLog,
                   wksp->sortedSymbol, sizeOfSort,
                   wksp->rankStart0, wksp->rankVal, maxW,
                   tableLog+1,
                   wksp->calleeWksp, sizeof(wksp->calleeWksp) / sizeof(U32));

    dtd.tableLog = (BYTE)maxTableLog;
    dtd.tableType = 1;
    ZSTD_memcpy(DTable, &dtd, sizeof(dtd));
    return iSize;
}